

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O2

nh_topten_entry *
nh_get_topten(int *out_len,char *statusbuf,char *player,int top,int around,boolean own)

{
  xchar xVar1;
  int iVar2;
  char *__s1;
  toptenentry *__dest;
  undefined1 *__ptr;
  nh_topten_entry *__s;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  toptenentry *ptVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  toptenentry newtt;
  
  xVar1 = dungeon_topology.d_wiz1_level.dlevel;
  bVar12 = true;
  if ((dungeon_topology.d_wiz1_level.dlevel != '\0') && (moves != 0)) {
    bVar12 = program_state.gameover == 0;
  }
  *statusbuf = '\0';
  *out_len = 0;
  iVar3 = exit_jmp_buf_valid + 1;
  bVar13 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar3;
  if ((bVar13) && (iVar3 = __sigsetjmp(exit_jmp_buf), iVar3 != 0)) {
    __s = (nh_topten_entry *)0x0;
  }
  else {
    if (xVar1 == '\0') {
      dlb_init();
      init_dungeons();
    }
    if (bVar12) {
      __s1 = "";
    }
    else {
      __s1 = plname;
    }
    if (player != (char *)0x0) {
      __s1 = player;
    }
    iVar3 = open_datafile("record",0,2);
    __dest = read_topten(iVar3,10000);
    close(iVar3);
    if (__dest != (toptenentry *)0x0) {
      uVar8 = 0xffffffff;
      if ((!bVar12) && (iVar3 = strcmp(__s1,plname), iVar3 == 0)) {
        fill_topten_entry(&newtt,end_how);
        uVar9 = 0xffffffffffffffff;
        uVar7 = 0;
        for (ptVar6 = __dest; (uVar7 != 10000 && ((0 < ptVar6->points || (ptVar6->deathlev != 0))));
            ptVar6 = ptVar6 + 1) {
          iVar3 = bcmp(ptVar6,&newtt,0xc0);
          if (iVar3 == 0) {
            uVar9 = uVar7;
          }
          uVar9 = uVar9 & 0xffffffff;
          uVar7 = uVar7 + 1;
        }
        uVar8 = (uint)uVar9;
        if (flags.explore == '\0' && flags.debug == '\0') {
          if (uVar8 < 10) {
            builtin_strncpy(statusbuf,"You made the top ten list!",0x1b);
          }
          else {
            pcVar4 = ordin(uVar8 + 1);
            sprintf(statusbuf,"You reached the %d%s place on the score list.",(ulong)(uVar8 + 1),
                    pcVar4);
          }
        }
        else {
          pcVar4 = "discover";
          if (flags.debug != '\0') {
            pcVar4 = "wizard";
          }
          sprintf(statusbuf,"Since you were in %s mode, your game was not added to the score list.",
                  pcVar4);
        }
      }
      __ptr = (undefined1 *)calloc(10000,1);
      uVar7 = 0;
      uVar9 = uVar7;
      for (pcVar4 = __dest->name;
          (iVar3 = (int)uVar9, uVar7 != 10000 &&
          ((0 < ((toptenentry *)(pcVar4 + -0x4c))->points || (*(int *)(pcVar4 + -0x44) != 0))));
          pcVar4 = pcVar4 + 0xc0) {
        if (top == -1 || (long)uVar7 < (long)top) {
          __ptr[uVar7] = 1;
        }
        if ((own != '\0') && (iVar2 = strcmp(__s1,pcVar4), iVar2 == 0)) {
          __ptr[uVar7] = 1;
        }
        if (((uVar8 == 0xffffffff) || ((long)uVar7 < (long)(int)(uVar8 - around))) ||
           ((long)(int)(around + uVar8) < (long)uVar7)) {
          uVar5 = (uint)(__ptr[uVar7] != '\0');
        }
        else {
          __ptr[uVar7] = 1;
          uVar5 = 1;
        }
        uVar9 = (ulong)(iVar3 + uVar5);
        uVar7 = uVar7 + 1;
      }
      bVar13 = iVar3 == 0;
      if (!bVar12 && bVar13) {
        memcpy(__dest,&newtt,0xc0);
        *__ptr = 1;
        iVar3 = 1;
      }
      __s = (nh_topten_entry *)xmalloc((int)((long)iVar3 * 0x298));
      uVar5 = 0;
      memset(__s,0,(long)iVar3 * 0x298);
      *out_len = iVar3;
      lVar10 = 0;
      do {
        ptVar6 = __dest + lVar10;
        lVar11 = lVar10;
        while( true ) {
          lVar10 = lVar11 + 1;
          if ((lVar10 == 0x2711) || ((ptVar6->points < 1 && (ptVar6->deathlev == 0)))) {
            if (!bVar12 && bVar13) {
              __s->rank = -1;
              __s->highlight = '\x01';
            }
            if (xVar1 == '\0') {
              free_dungeon();
              dlb_cleanup();
            }
            free(__ptr);
            free(__dest);
            goto LAB_0024e820;
          }
          if (__ptr[lVar11] != '\0') break;
          ptVar6 = ptVar6 + 1;
          lVar11 = lVar10;
        }
        uVar9 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        fill_nh_score_entry(ptVar6,__s + uVar9,(int)lVar10,lVar10 - (ulong)uVar8 == 1);
      } while( true );
    }
    builtin_strncpy(statusbuf,"Cannot open record file!",0x19);
    __s = (nh_topten_entry *)0x0;
LAB_0024e820:
    exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  }
  return __s;
}

Assistant:

struct nh_topten_entry *nh_get_topten(int *out_len, char *statusbuf,
				      const char *player, int top, int around, boolean own)
{
    struct toptenentry *ttlist, newtt;
    struct nh_topten_entry *score_list;
    boolean game_inited = (wiz1_level.dlevel != 0);
    boolean game_complete = game_inited && moves && program_state.gameover;
    int rank = -1; /* index of the completed game in the topten list */
    int fd, i, j, sel_count;
    boolean *selected, off_list = FALSE;
    
    statusbuf[0] = '\0';
    *out_len = 0;
    
    if (!api_entry_checkpoint())
	return NULL;
    
    if (!game_inited) {
	/* If nh_get_topten() isn't called after a game, we never went through
	 * initialization. */
	dlb_init();
	init_dungeons();
    }
    
    if (!player) {
	if (game_complete)
	    player = plname;
	else
	    player = "";
    }
    
    fd = open_datafile(RECORD, O_RDONLY, SCOREPREFIX);
    ttlist = read_topten(fd, TTLISTLEN);
    close(fd);
    if (!ttlist) {
	strcpy(statusbuf, "Cannot open record file!");
	api_exit();
	return NULL;
    }
    
    /* find the rank of a completed game in the score list */
    if (game_complete && !strcmp(player, plname)) {
	fill_topten_entry(&newtt, end_how);
	
	/* find this entry in the list */
	for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++)
	    if (!memcmp(&ttlist[i], &newtt, sizeof(struct toptenentry)))
		rank = i;
	
	if (wizard || discover)
	    sprintf(statusbuf, "Since you were in %s mode, your game was not "
	            "added to the score list.", wizard ? "wizard" : "discover");
	else if (rank >= 0 && rank < 10)
	    sprintf(statusbuf, "You made the top ten list!");
	else if (rank)
	    sprintf(statusbuf, "You reached the %d%s place on the score list.",
		    rank+1, ordin(rank+1));
    }
    
    /* select scores for display */
    sel_count = 0;
    selected = calloc(TTLISTLEN, sizeof(boolean));
    
    for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++) {
	if (top == -1 || i < top)
	    selected[i] = TRUE;
	
	if (own && !strcmp(player, ttlist[i].name))
	    selected[i] = TRUE;
	
	if (rank != -1 && rank - around <= i && i <= rank + around)
	    selected[i] = TRUE;
	
	if (selected[i])
	    sel_count++;
    }
    
    if (game_complete && sel_count == 0) {
	/* didn't make it onto the list and nothing else is selected */
	ttlist[0] = newtt;
	selected[0] = TRUE;
	sel_count++;
	off_list = TRUE;
    }
    
    
    score_list = xmalloc(sel_count * sizeof(struct nh_topten_entry));
    memset(score_list, 0, sel_count * sizeof(struct nh_topten_entry));
    *out_len = sel_count;
    j = 0;
    for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++) {
	if (selected[i])
	    fill_nh_score_entry(&ttlist[i], &score_list[j++], i+1, i == rank);
    }
    
    if (off_list) {
	score_list[0].rank = -1;
	score_list[0].highlight = TRUE;
    }
    
    if (!game_inited) {
	    free_dungeon();
	    dlb_cleanup();
    }
    
    free(selected);
    free(ttlist);
    
    api_exit();
    return score_list;
}